

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_transport_close_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  uint8_t *in_RCX;
  uint64_t in_R8;
  uint64_t unaff_R14;
  uint64_t unaff_R15;
  ptls_iovec_t reason_phrase;
  
  end = state->end;
  uVar3 = ptls_decode_quicint(&state->src,end);
  iVar2 = 0x20007;
  if (uVar3 == 0xffffffffffffffff) {
    bVar1 = false;
  }
  else {
    unaff_R15 = ptls_decode_quicint(&state->src,end);
    unaff_R14 = uVar3;
    if (((unaff_R15 == 0xffffffffffffffff) ||
        (uVar3 = ptls_decode_quicint(&state->src,end), uVar3 == 0xffffffffffffffff)) ||
       (in_RCX = state->src, in_R8 = uVar3, (ulong)((long)end - (long)in_RCX) < uVar3)) {
      bVar1 = false;
    }
    else {
      state->src = in_RCX + uVar3;
      bVar1 = true;
      iVar2 = 0;
    }
  }
  if (!bVar1) {
    return iVar2;
  }
  reason_phrase.len = in_R8;
  reason_phrase.base = in_RCX;
  iVar2 = handle_close(conn,(uint)unaff_R14 & 0xffff | 0x20000,unaff_R15,reason_phrase);
  return iVar2;
}

Assistant:

static int handle_transport_close_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_transport_close_frame_t frame;
    int ret;

    if ((ret = quicly_decode_transport_close_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(TRANSPORT_CLOSE_RECEIVE, conn, conn->stash.now, frame.error_code, frame.frame_type,
                 QUICLY_PROBE_ESCAPE_UNSAFE_STRING(frame.reason_phrase.base, frame.reason_phrase.len));
    return handle_close(conn, QUICLY_ERROR_FROM_TRANSPORT_ERROR_CODE(frame.error_code), frame.frame_type, frame.reason_phrase);
}